

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  SessionHandle *data;
  curl_sockopt_callback p_Var1;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  uint uVar5;
  if2ip_result_t iVar6;
  size_t sVar7;
  uint *puVar8;
  int *piVar9;
  int iVar10;
  ushort uVar11;
  char *pcVar12;
  char *fmt;
  socklen_t __len;
  uint uVar13;
  byte *__s;
  SessionHandle *pSVar14;
  timeval tVar15;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  long port;
  Curl_sockaddr_storage sa;
  char ipaddress [46];
  int optval;
  Curl_sockaddr_ex addr;
  Curl_sockaddr_storage add;
  uint local_324;
  SessionHandle *local_320;
  ulong local_318;
  Curl_dns_entry *local_310;
  undefined4 local_308;
  socklen_t local_304;
  long local_300;
  sockaddr local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char local_278 [48];
  uint local_248 [64];
  undefined1 local_148 [144];
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pSVar14 = conn->data;
  *sockp = -1;
  puVar8 = &local_324;
  CVar3 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_148,(curl_socket_t *)puVar8);
  if (CVar3 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var2 = getaddressinfo((sockaddr *)(local_148 + 0x10),local_278,&local_300);
  if (!_Var2) {
    puVar8 = (uint *)__errno_location();
    uVar13 = *puVar8;
    pcVar12 = Curl_strerror(conn,uVar13);
    Curl_failf(pSVar14,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar13,pcVar12);
    Curl_closesocket(conn,local_324);
    return CURLE_OK;
  }
  Curl_infof(pSVar14,"  Trying %s...\n",local_278);
  uVar13 = local_324;
  if ((pSVar14->set).tcp_nodelay == true) {
    data = conn->data;
    puVar8 = local_248;
    local_248[0] = (uint)(data->set).tcp_nodelay;
    iVar4 = setsockopt(local_324,6,1,puVar8,4);
    if (iVar4 < 0) {
      piVar9 = __errno_location();
      pcVar12 = Curl_strerror(conn,*piVar9);
      Curl_infof(data,"Could not set TCP_NODELAY: %s\n",pcVar12);
    }
    else {
      Curl_infof(data,"TCP_NODELAY set\n");
    }
  }
  uVar5 = (uint)(pSVar14->set).tcp_keepalive;
  if (uVar5 == 1) {
    puVar8 = local_248;
    local_248[0] = uVar5;
    iVar4 = setsockopt(uVar13,1,9,puVar8,4);
    if (iVar4 < 0) {
      pcVar12 = "Failed to set SO_KEEPALIVE on fd %d\n";
    }
    else {
      local_248[0] = curlx_sltosi((pSVar14->set).tcp_keepidle);
      iVar4 = setsockopt(uVar13,6,4,local_248,4);
      if (iVar4 < 0) {
        Curl_infof(pSVar14,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar13);
      }
      local_248[0] = curlx_sltosi((pSVar14->set).tcp_keepintvl);
      puVar8 = local_248;
      iVar4 = setsockopt(uVar13,6,5,puVar8,4);
      if (-1 < iVar4) goto LAB_00467c76;
      pcVar12 = "Failed to set TCP_KEEPINTVL on fd %d\n";
    }
    Curl_infof(pSVar14,pcVar12,(ulong)uVar13);
  }
LAB_00467c76:
  p_Var1 = (pSVar14->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar4 = (*p_Var1)((pSVar14->set).sockopt_client,uVar13,CURLSOCKTYPE_IPCXN), iVar4 == 0)) {
    local_308 = 0;
  }
  else {
    local_308 = (undefined4)CONCAT71((int7)((ulong)puVar8 >> 8),1);
    if (iVar4 != 2) {
      Curl_closesocket(conn,uVar13);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  local_320 = conn->data;
  local_310 = (Curl_dns_entry *)0x0;
  uVar11 = (local_320->set).localport;
  iVar4 = (local_320->set).localportrange;
  __s = (byte *)(local_320->set).str[5];
  memset(local_248,0,0x100);
  if (uVar11 == 0 && __s == (byte *)0x0) goto LAB_00467e7c;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8.sa_family = 0;
  local_2f8.sa_data[0] = '\0';
  local_2f8.sa_data[1] = '\0';
  local_2f8.sa_data[2] = '\0';
  local_2f8.sa_data[3] = '\0';
  local_2f8.sa_data[4] = '\0';
  local_2f8.sa_data[5] = '\0';
  local_2f8.sa_data[6] = '\0';
  local_2f8.sa_data[7] = '\0';
  local_2f8.sa_data[8] = '\0';
  local_2f8.sa_data[9] = '\0';
  local_2f8.sa_data[10] = '\0';
  local_2f8.sa_data[0xb] = '\0';
  local_2f8.sa_data[0xc] = '\0';
  local_2f8.sa_data[0xd] = '\0';
  if ((__s == (byte *)0x0) || (sVar7 = strlen((char *)__s), 0xfe < sVar7)) {
    __len = 0;
    if (local_148._0_4_ == 2) {
LAB_00467d9c:
      local_2f8.sa_data._0_2_ = uVar11 << 8 | uVar11 >> 8;
      local_2f8.sa_family = 2;
      __len = 0x10;
    }
LAB_00467db4:
    iVar10 = bind(uVar13,&local_2f8,__len);
    while (iVar10 < 0) {
      if (iVar4 < 2) {
        puVar8 = (uint *)__errno_location();
        pSVar14 = local_320;
        uVar13 = *puVar8;
        (local_320->state).os_errno = uVar13;
        pcVar12 = Curl_strerror(conn,uVar13);
        fmt = "bind failed with errno %d: %s";
        goto LAB_00467f72;
      }
      Curl_infof(local_320,"Bind to local port %hu failed, trying next\n",(ulong)uVar11);
      uVar11 = uVar11 + 1;
      if (local_2f8.sa_family == 2) {
        local_2f8.sa_data._0_2_ = uVar11 * 0x100 | uVar11 >> 8;
        local_2f8.sa_family = 2;
      }
      iVar10 = bind(uVar13,&local_2f8,__len);
      iVar4 = iVar4 + -1;
    }
    local_304 = 0x80;
    local_b8.sa_family = 0;
    local_b8.sa_data[0] = '\0';
    local_b8.sa_data[1] = '\0';
    local_b8.sa_data[2] = '\0';
    local_b8.sa_data[3] = '\0';
    local_b8.sa_data[4] = '\0';
    local_b8.sa_data[5] = '\0';
    local_b8.sa_data[6] = '\0';
    local_b8.sa_data[7] = '\0';
    local_b8.sa_data[8] = '\0';
    local_b8.sa_data[9] = '\0';
    local_b8.sa_data[10] = '\0';
    local_b8.sa_data[0xb] = '\0';
    local_b8.sa_data[0xc] = '\0';
    local_b8.sa_data[0xd] = '\0';
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    iVar4 = getsockname(uVar13,&local_b8,&local_304);
    if (-1 < iVar4) {
      Curl_infof(local_320,"Local port: %hu\n",(ulong)uVar11);
      (conn->bits).bound = true;
      uVar13 = local_324;
LAB_00467e7c:
      curlx_nonblock(uVar13,1);
      tVar15 = curlx_tvnow();
      conn->connecttime = tVar15;
      if (1 < conn->num_addr) {
        Curl_expire_latest(pSVar14,conn->timeoutms_per_addr);
      }
      if ((((char)local_308 == '\0') && (conn->socktype == 1)) &&
         (iVar4 = connect(uVar13,(sockaddr *)(local_148 + 0x10),local_148._12_4_), iVar4 == -1)) {
        piVar9 = __errno_location();
        iVar4 = *piVar9;
        if ((iVar4 != 0xb) && (iVar4 != 0x73)) {
          pcVar12 = Curl_strerror(conn,iVar4);
          Curl_infof(pSVar14,"Immediate connect fail for %s: %s\n",local_278,pcVar12);
          (pSVar14->state).os_errno = iVar4;
          Curl_closesocket(conn,uVar13);
          return CURLE_COULDNT_CONNECT;
        }
      }
      *sockp = uVar13;
      return CURLE_OK;
    }
    puVar8 = (uint *)__errno_location();
    pSVar14 = local_320;
    uVar13 = *puVar8;
    (local_320->state).os_errno = uVar13;
    pcVar12 = Curl_strerror(conn,uVar13);
    fmt = "getsockname() failed with errno %d: %s";
LAB_00467f72:
    Curl_failf(pSVar14,fmt,(ulong)uVar13,pcVar12);
    goto LAB_00467f81;
  }
  iVar10 = *__s - 0x69;
  if ((iVar10 == 0) && (iVar10 = __s[1] - 0x66, iVar10 == 0)) {
    iVar10 = 0x21 - (uint)__s[2];
  }
  else {
    iVar10 = -iVar10;
  }
  local_318 = CONCAT44(local_318._4_4_,iVar10);
  if (iVar10 != 0) {
    iVar10 = strncmp("host!",(char *)__s,5);
    if (iVar10 != 0) goto LAB_00468002;
    __s = __s + 5;
    goto LAB_004680f1;
  }
  __s = __s + 3;
LAB_00468002:
  iVar6 = Curl_if2ip(local_148._0_4_,conn->scope,(char *)__s,(char *)local_248,0x100);
  if (iVar6 == IF2IP_FOUND) {
    Curl_infof(local_320,"Local Interface %s is ip %s using address family %i\n",__s,local_248,
               (ulong)(uint)local_148._0_4_);
    sVar7 = strlen((char *)__s);
    iVar10 = setsockopt(uVar13,1,0x19,__s,(int)sVar7 + 1);
    if (iVar10 != 0) {
      piVar9 = __errno_location();
      local_318 = CONCAT44(local_318._4_4_,*piVar9);
      pcVar12 = Curl_strerror(conn,*piVar9);
      Curl_infof(local_320,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",__s
                 ,local_318 & 0xffffffff,pcVar12);
    }
LAB_0046818e:
    __len = 0;
    if ((local_148._0_4_ == 2) &&
       (iVar10 = inet_pton(2,(char *)local_248,local_2f8.sa_data + 2), 0 < iVar10))
    goto LAB_00467d9c;
    goto LAB_00467db4;
  }
  if (iVar6 == IF2IP_AF_NOT_SUPPORTED) {
    Curl_closesocket(conn,uVar13);
    return CURLE_OK;
  }
  if (iVar6 == IF2IP_NOT_FOUND) {
    if ((int)local_318 != 0) {
LAB_004680f1:
      local_318 = conn->ip_version;
      if (local_148._0_4_ == 2) {
        conn->ip_version = 1;
      }
      Curl_resolv(conn,(char *)__s,0,&local_310);
      conn->ip_version = local_318;
      if (local_310 != (Curl_dns_entry *)0x0) {
        Curl_printable_address(local_310->addr,(char *)local_248,0x100);
        Curl_infof(local_320,"Name \'%s\' family %i resolved to \'%s\' family %i\n",__s,
                   (ulong)(uint)local_148._0_4_,local_248,(ulong)(uint)local_310->addr->ai_family);
        Curl_resolv_unlock(local_320,local_310);
        goto LAB_0046818e;
      }
      goto LAB_004681c0;
    }
    pcVar12 = "Couldn\'t bind to interface \'%s\'";
  }
  else {
    if ((int)local_318 != 0) goto LAB_004680f1;
LAB_004681c0:
    pcVar12 = "Couldn\'t bind to \'%s\'";
  }
  Curl_failf(local_320,pcVar12,__s);
LAB_00467f81:
  Curl_closesocket(conn,local_324);
  return CURLE_INTERFACE_FAILED;
}

Assistant:

static CURLcode
singleipconnect(struct connectdata *conn,
                const Curl_addrinfo *ai,
                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode res = CURLE_OK;
  char ipaddress[MAX_IPADR_LEN];
  long port;

  *sockp = CURL_SOCKET_BAD;

  res = Curl_socket(conn, ai, &addr, &sockfd);
  if(res)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

  if(data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  res = bindlocal(conn, sockfd, addr.family);
  if(res) {
    Curl_closesocket(conn, sockfd); /* close socket and bail out */
    if(res == CURLE_UNSUPPORTED_PROTOCOL) {
      /* The address family is not supported on this interface.
         We can continue trying addresses */
      return CURLE_OK;
    }
    return res;
  }

  /* set socket non-blocking */
  curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      res = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn,error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      res = CURLE_COULDNT_CONNECT;
    }
  }

  if(!res)
    *sockp = sockfd;

  return res;
}